

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

bool __thiscall
cppcms::anon_unknown_0::mounted::dispatch
          (mounted *this,string *url,char *method,application *param_4)

{
  bool bVar1;
  long in_RDI;
  sub_match<const_char_*> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  option *in_stack_ffffffffffffff78;
  long *plVar2;
  match_results<const_char_*> *in_stack_ffffffffffffff90;
  string local_48 [72];
  
  bVar1 = option::matches(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          (char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    plVar2 = *(long **)(in_RDI + 0x68);
    booster::match_results<const_char_*>::operator[]
              (in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20));
    booster::sub_match::operator_cast_to_string(in_stack_ffffffffffffff68);
    (**(code **)(*plVar2 + 0x10))(plVar2,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return bVar1;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					app_->main(match_[select_]);
					return true;
				}
				return false;
			}